

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_state_init(LodePNGState *state)

{
  long in_RDI;
  
  lodepng_decoder_settings_init((LodePNGDecoderSettings *)0x11ec62);
  lodepng_encoder_settings_init((LodePNGEncoderSettings *)0x11ec6f);
  lodepng_color_mode_init((LodePNGColorMode *)(in_RDI + 0x90));
  lodepng_info_init((LodePNGInfo *)0x11ec8f);
  *(undefined4 *)(in_RDI + 0x1a0) = 1;
  return;
}

Assistant:

void lodepng_state_init(LodePNGState* state)
{
#ifdef LODEPNG_COMPILE_DECODER
	lodepng_decoder_settings_init(&state->decoder);
#endif /*LODEPNG_COMPILE_DECODER*/
#ifdef LODEPNG_COMPILE_ENCODER
	lodepng_encoder_settings_init(&state->encoder);
#endif /*LODEPNG_COMPILE_ENCODER*/
	lodepng_color_mode_init(&state->info_raw);
	lodepng_info_init(&state->info_png);
	state->error = 1;
}